

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::TreeTests_TooManyRightParens_Test::TestBody(TreeTests_TooManyRightParens_Test *this)

{
  bool bVar1;
  AssertHelper local_78;
  Message local_70 [2];
  invalid_argument *anon_var_0;
  string_view local_58;
  Tree local_48;
  byte local_19;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  TreeTests_TooManyRightParens_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    local_19 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_58,"(ROOT foo))");
      readTree(&local_48,local_58);
      std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::~vector(&local_48);
    }
    if ((local_19 & 1) != 0) {
      return;
    }
    pcStack_18 = 
    "Expected: readTree(\"(ROOT foo))\") throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_70);
  testing::internal::AssertHelper::AssertHelper
            (&local_78,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
             ,0x2c,pcStack_18);
  testing::internal::AssertHelper::operator=(&local_78,local_70);
  testing::internal::AssertHelper::~AssertHelper(&local_78);
  testing::Message::~Message(local_70);
  return;
}

Assistant:

TEST(TreeTests, TooManyRightParens) {
 EXPECT_THROW(readTree("(ROOT foo))"), std::invalid_argument);
}